

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O2

int __thiscall InvertDatabase::in_mem(InvertDatabase *this,int it)

{
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_20,
               *(__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> **
                )&(((this->_items).
                    super__Vector_base<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [(this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[it]].
                    super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theIval).
                  super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return (int)(local_20._M_ptr != (element_type *)0x0);
}

Assistant:

int in_mem(int it) {
        if (_items[fidx[it]]->ival()->array() == nullptr) return 0;
        else return 1;
    }